

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O2

redisContext * redisConnectWithOptions(redisOptions *options)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  redisContext *c;
  sds pcVar4;
  redisReader *prVar5;
  bool bVar6;
  
  c = (redisContext *)calloc(1,0xf0);
  if (c != (redisContext *)0x0) {
    c->funcs = &redisContextDefaultFuncs;
    pcVar4 = sdsempty();
    c->obuf = pcVar4;
    prVar5 = redisReaderCreate();
    c->reader = prVar5;
    c->fd = -1;
    if (prVar5 != (redisReader *)0x0 && pcVar4 != (sds)0x0) {
      uVar1 = options->options;
      bVar6 = (uVar1 & 1) == 0;
      if (bVar6) {
        c->flags = 1;
      }
      uVar3 = (uint)bVar6;
      if ((uVar1 & 2) != 0) {
        uVar3 = uVar3 | 0x80;
        c->flags = uVar3;
      }
      if ((uVar1 & 4) != 0) {
        uVar3 = uVar3 | 0x200;
        c->flags = uVar3;
      }
      iVar2 = options->type;
      if (iVar2 == 2) {
        c->fd = (options->endpoint).fd;
        c->flags = uVar3 | 2;
      }
      else if (iVar2 == 1) {
        redisContextConnectUnix(c,(options->endpoint).tcp.source_addr,options->timeout);
      }
      else {
        if (iVar2 != 0) {
          return (redisContext *)0x0;
        }
        redisContextConnectBindTcp
                  (c,(options->endpoint).tcp.ip,(options->endpoint).tcp.port,options->timeout,
                   (options->endpoint).tcp.source_addr);
      }
      if (options->timeout == (timeval *)0x0) {
        return c;
      }
      if ((c->flags & 1) == 0) {
        return c;
      }
      if (c->fd != -1) {
        redisContextSetTimeout(c,*options->timeout);
        return c;
      }
      return c;
    }
    redisFree(c);
  }
  return (redisContext *)0x0;
}

Assistant:

redisContext *redisConnectWithOptions(const redisOptions *options) {
    redisContext *c = redisContextInit(options);
    if (c == NULL) {
        return NULL;
    }
    if (!(options->options & REDIS_OPT_NONBLOCK)) {
        c->flags |= REDIS_BLOCK;
    }
    if (options->options & REDIS_OPT_REUSEADDR) {
        c->flags |= REDIS_REUSEADDR;
    }
    if (options->options & REDIS_OPT_NOAUTOFREE) {
      c->flags |= REDIS_NO_AUTO_FREE;
    }

    if (options->type == REDIS_CONN_TCP) {
        redisContextConnectBindTcp(c, options->endpoint.tcp.ip,
                                   options->endpoint.tcp.port, options->timeout,
                                   options->endpoint.tcp.source_addr);
    } else if (options->type == REDIS_CONN_UNIX) {
        redisContextConnectUnix(c, options->endpoint.unix_socket,
                                options->timeout);
    } else if (options->type == REDIS_CONN_USERFD) {
        c->fd = options->endpoint.fd;
        c->flags |= REDIS_CONNECTED;
    } else {
        // Unknown type - FIXME - FREE
        return NULL;
    }
    if (options->timeout != NULL && (c->flags & REDIS_BLOCK) && c->fd != REDIS_INVALID_FD) {
        redisContextSetTimeout(c, *options->timeout);
    }
    return c;
}